

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

BroadcastToDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_broadcasttodynamic(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x456) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x456;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    BroadcastToDynamicLayerParams::BroadcastToDynamicLayerParams(this_00.broadcasttodynamic_);
    (this->layer_).broadcasttodynamic_ = (BroadcastToDynamicLayerParams *)this_00;
  }
  return (BroadcastToDynamicLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::BroadcastToDynamicLayerParams* NeuralNetworkLayer::mutable_broadcasttodynamic() {
  if (!has_broadcasttodynamic()) {
    clear_layer();
    set_has_broadcasttodynamic();
    layer_.broadcasttodynamic_ = new ::CoreML::Specification::BroadcastToDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.broadcastToDynamic)
  return layer_.broadcasttodynamic_;
}